

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_ldst.inc.c
# Opt level: O0

void address_space_stw_le_riscv32
               (uc_struct_conflict12 *uc,AddressSpace *as,hwaddr addr,uint32_t val,MemTxAttrs attrs,
               MemTxResult *result)

{
  MemTxResult *result_local;
  uint32_t val_local;
  hwaddr addr_local;
  AddressSpace *as_local;
  uc_struct_conflict12 *uc_local;
  MemTxAttrs attrs_local;
  
  address_space_stw_internal_riscv32(uc,as,addr,val,attrs,result,DEVICE_LITTLE_ENDIAN);
  return;
}

Assistant:

void glue(address_space_stw_le, SUFFIX)(struct uc_struct *uc, ARG1_DECL,
    hwaddr addr, uint32_t val, MemTxAttrs attrs, MemTxResult *result)
{
    glue(address_space_stw_internal, SUFFIX)(uc, ARG1, addr, val, attrs, result,
                                             DEVICE_LITTLE_ENDIAN);
}